

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setvarchecked(ident *id,int val)

{
  int local_14;
  int val_local;
  ident *id_local;
  
  if ((id->flags & 8U) == 0) {
    if (((identflags & 0x10U) == 0) && ((id->flags & 2U) == 0)) {
      if ((id->flags & 0x10U) != 0) {
        id->flags = id->flags & 0xffffffef;
      }
    }
    else {
      if ((id->flags & 1U) != 0) {
        debugcode("cannot override persistent variable %s",id->name);
        return;
      }
      if ((id->flags & 0x10U) == 0) {
        (id->field_5).argmask = *(uint *)(id->field_4).args;
        id->flags = id->flags | 0x10;
      }
    }
    if ((val < (id->field_2).minval) || (local_14 = val, (id->field_3).maxval < val)) {
      local_14 = clampvar(id,val,(id->field_2).minval,(id->field_3).maxval);
    }
    *(int *)(id->field_4).args = local_14;
    ident::changed(id);
  }
  else {
    debugcode("variable %s is read-only",id->name);
  }
  return;
}

Assistant:

void setvarchecked(ident *id, int val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.i = *id->storage.i, , )
        if(val < id->minval || val > id->maxval) val = clampvar(id, val, id->minval, id->maxval);
        *id->storage.i = val;
        id->changed();                                             // call trigger function if available
    }
}